

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

int Curl_wait_ms(timediff_t timeout_ms)

{
  int *piVar1;
  timeval *__timeout;
  undefined1 local_30 [8];
  timeval pending_tv;
  int r;
  timediff_t timeout_ms_local;
  
  pending_tv.tv_usec._4_4_ = 0;
  if (timeout_ms == 0) {
    timeout_ms_local._4_4_ = 0;
  }
  else if (timeout_ms < 0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    timeout_ms_local._4_4_ = -1;
  }
  else {
    __timeout = curlx_mstotv((timeval *)local_30,timeout_ms);
    pending_tv.tv_usec._4_4_ =
         select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)__timeout);
    if (pending_tv.tv_usec._4_4_ != 0) {
      if ((pending_tv.tv_usec._4_4_ == -1) && (piVar1 = __errno_location(), *piVar1 == 4)) {
        pending_tv.tv_usec._4_4_ = 0;
      }
      else {
        pending_tv.tv_usec._4_4_ = -1;
      }
    }
    timeout_ms_local._4_4_ = pending_tv.tv_usec._4_4_;
  }
  return timeout_ms_local._4_4_;
}

Assistant:

int Curl_wait_ms(timediff_t timeout_ms)
{
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    SET_SOCKERRNO(EINVAL);
    return -1;
  }
#if defined(MSDOS)
  delay(timeout_ms);
#elif defined(_WIN32)
  /* prevent overflow, timeout_ms is typecast to ULONG/DWORD. */
#if TIMEDIFF_T_MAX >= ULONG_MAX
  if(timeout_ms >= ULONG_MAX)
    timeout_ms = ULONG_MAX-1;
    /* do not use ULONG_MAX, because that is equal to INFINITE */
#endif
  Sleep((ULONG)timeout_ms);
#else
  /* avoid using poll() for this since it behaves incorrectly with no sockets
     on Apple operating systems */
  {
    struct timeval pending_tv;
    r = select(0, NULL, NULL, NULL, curlx_mstotv(&pending_tv, timeout_ms));
  }
#endif /* _WIN32 */
  if(r) {
    if((r == -1) && (SOCKERRNO == EINTR))
      /* make EINTR from select or poll not a "lethal" error */
      r = 0;
    else
      r = -1;
  }
  return r;
}